

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::AppendToList
          (ExtensionSet *this,Descriptor *extendee,DescriptorPool *pool,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  KeyValue *pKVar1;
  int iVar2;
  iterator iVar3;
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *pvVar4;
  int iVar5;
  FieldDescriptor **__args;
  KeyValue *pKVar6;
  FieldDescriptor **ppFVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  KeyValue *pKVar11;
  bool bVar12;
  FieldDescriptor *local_60;
  DescriptorPool *local_58;
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *local_50;
  Descriptor *local_48;
  DescriptorPool *local_40;
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  **local_38;
  
  local_38 = &local_50;
  lVar9 = (long)(short)this->flat_size_;
  pKVar6 = (this->map_).flat;
  local_58 = pool;
  local_50 = (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)output;
  local_48 = extendee;
  local_40 = pool;
  if (lVar9 < 0) {
    AppendToList();
  }
  else {
    lVar10 = lVar9 * 0x20;
    pKVar1 = pKVar6 + lVar9;
    pKVar11 = pKVar6;
    if (this->flat_size_ != 0) {
      uVar8 = 0;
      do {
        lVar10 = lVar10 + -0x20;
        Extension::PrefetchPtr(&pKVar11->second);
        pKVar11 = pKVar11 + 1;
        if (lVar10 == 0) break;
        bVar12 = uVar8 < 0xf;
        uVar8 = uVar8 + 1;
      } while (bVar12);
    }
    if (pKVar11 != pKVar1) {
      ppFVar7 = &(pKVar6->second).descriptor;
      do {
        __args = ppFVar7;
        iVar2 = *(int *)(__args + -3);
        if (*(bool *)((long)__args + -7) == true) {
          iVar5 = Extension::GetSize((Extension *)(__args + -2));
          bVar12 = 0 < iVar5;
        }
        else {
          bVar12 = ((ulong)*__args & 0x20000) == 0;
        }
        pvVar4 = local_50;
        if (bVar12) {
          if (*__args == (FieldDescriptor *)0x0) {
            local_60 = DescriptorPool::FindExtensionByNumber(local_58,extendee,iVar2);
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::emplace_back<google::protobuf::FieldDescriptor_const*>(pvVar4,&local_60);
          }
          else {
            iVar3._M_current = *(FieldDescriptor ***)(local_50 + 8);
            if (iVar3._M_current == *(FieldDescriptor ***)(local_50 + 0x10)) {
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        (local_50,iVar3,__args);
            }
            else {
              *iVar3._M_current = *__args;
              *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
            }
          }
        }
        Extension::PrefetchPtr(&pKVar11->second);
        pKVar11 = pKVar11 + 1;
        ppFVar7 = __args + 4;
      } while (pKVar11 != pKVar1);
      pKVar6 = (KeyValue *)(__args + 1);
    }
    if (pKVar6 != pKVar1) {
      ppFVar7 = &(pKVar6->second).descriptor;
      do {
        iVar2 = *(int *)(ppFVar7 + -3);
        if (*(bool *)((long)ppFVar7 + -7) == true) {
          iVar5 = Extension::GetSize((Extension *)(ppFVar7 + -2));
          bVar12 = 0 < iVar5;
        }
        else {
          bVar12 = ((ulong)*ppFVar7 & 0x20000) == 0;
        }
        pvVar4 = local_50;
        if (bVar12) {
          if (*ppFVar7 == (FieldDescriptor *)0x0) {
            local_60 = DescriptorPool::FindExtensionByNumber(local_58,extendee,iVar2);
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::emplace_back<google::protobuf::FieldDescriptor_const*>(pvVar4,&local_60);
          }
          else {
            iVar3._M_current = *(FieldDescriptor ***)(local_50 + 8);
            if (iVar3._M_current == *(FieldDescriptor ***)(local_50 + 0x10)) {
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        (local_50,iVar3,ppFVar7);
            }
            else {
              *iVar3._M_current = *ppFVar7;
              *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
            }
          }
        }
        pKVar6 = (KeyValue *)(ppFVar7 + 1);
        ppFVar7 = ppFVar7 + 4;
      } while (pKVar6 != pKVar1);
    }
  }
  return;
}

Assistant:

void ExtensionSet::AppendToList(
    const Descriptor* extendee, const DescriptorPool* pool,
    std::vector<const FieldDescriptor*>* output) const {
  ForEach(
      [extendee, pool, &output](int number, const Extension& ext) {
        bool has = false;
        if (ext.is_repeated) {
          has = ext.GetSize() > 0;
        } else {
          has = !ext.is_cleared;
        }

        if (has) {
          // TODO: Looking up each field by number is somewhat
          // unfortunate.
          //   Is there a better way?  The problem is that descriptors are
          //   lazily-initialized, so they might not even be constructed until
          //   AppendToList() is called.

          if (ext.descriptor == nullptr) {
            output->push_back(pool->FindExtensionByNumber(extendee, number));
          } else {
            output->push_back(ext.descriptor);
          }
        }
      },
      Prefetch{});
}